

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  LZ4_stream_t_internal *__src;
  char cVar1;
  uint uVar2;
  int iVar3;
  BYTE *s;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  ulong *puVar7;
  ulong *puVar8;
  char *pcVar9;
  long *plVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong *puVar17;
  ulong *puVar18;
  undefined1 *puVar19;
  int *piVar20;
  long *plVar21;
  int iVar22;
  int iVar23;
  BYTE *d;
  char *pcVar24;
  BYTE *d_3;
  ulong uVar25;
  ulong uVar26;
  uint8_t *puVar27;
  ulong *puVar28;
  uint uVar29;
  LZ4_stream_t_internal *streamPtr;
  long lVar30;
  ulong *puVar31;
  long *plVar32;
  long *plVar33;
  char cVar34;
  undefined4 in_register_00000084;
  ulong uVar35;
  ulong uVar36;
  undefined4 in_register_0000008c;
  long lVar37;
  int *piVar38;
  ulong uVar39;
  ulong *puVar40;
  U32 *hashTable_18;
  long lVar41;
  uint uVar42;
  BYTE *e_2;
  ulong *puVar43;
  int iVar44;
  BYTE *e_3;
  uint8_t *puVar45;
  int *piVar46;
  ulong *puVar47;
  BYTE *e;
  long *plVar48;
  ulong uVar49;
  bool bVar50;
  U32 *hashTable;
  U32 *hashTable_22;
  ulong *local_f8;
  ulong *local_f0;
  long *local_e8;
  ulong *local_e0;
  int *local_d8;
  ulong *local_c8;
  long *local_b8;
  int *local_a0;
  ulong *local_88;
  
  piVar4 = (int *)CONCAT44(in_register_0000008c,acceleration);
  piVar20 = (int *)CONCAT44(in_register_00000084,maxOutputSize);
  if ((LZ4_stream->internal_donotuse).dirty != 0) {
    return 0;
  }
  uVar16 = (LZ4_stream->internal_donotuse).dictSize;
  puVar27 = (LZ4_stream->internal_donotuse).dictionary;
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  iVar3 = 1;
  if (1 < acceleration) {
    iVar3 = acceleration;
  }
  puVar45 = puVar27 + uVar16;
  if (puVar27 + uVar16 != (uint8_t *)source &&
      0xfffffffc < (LZ4_stream->internal_donotuse).dictSize - 4) {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
    puVar45 = (uint8_t *)source;
  }
  puVar27 = (uint8_t *)(source + inputSize);
  if (((uint8_t *)LZ4_stream->table[0x801] < puVar27) && (puVar27 < puVar45)) {
    uVar2 = (int)puVar45 - (int)puVar27;
    uVar16 = 0x10000;
    if (uVar2 < 0x10000) {
      uVar16 = uVar2;
    }
    uVar25 = 0;
    if (3 < uVar2) {
      uVar25 = (ulong)uVar16;
    }
    (LZ4_stream->internal_donotuse).dictSize = (uint32_t)uVar25;
    (LZ4_stream->internal_donotuse).dictionary = puVar45 + -uVar25;
  }
  iVar44 = (int)dest;
  if (puVar45 != (uint8_t *)source) {
    __src = (LZ4_stream->internal_donotuse).dictCtx;
    local_e0 = (ulong *)source;
    local_f8 = (ulong *)dest;
    if (__src == (LZ4_stream_t_internal *)0x0) {
      uVar16 = (LZ4_stream->internal_donotuse).dictSize;
      uVar25 = (ulong)uVar16;
      if (uVar25 < 0x10000) {
        uVar2 = (LZ4_stream->internal_donotuse).currentOffset;
        if (uVar16 < uVar2) {
          if ((uint)inputSize < 0x7e000001) {
            piVar20 = (int *)(LZ4_stream->internal_donotuse).dictionary;
            pcVar6 = dest + maxOutputSize;
            (LZ4_stream->internal_donotuse).dictSize = uVar16 + inputSize;
            (LZ4_stream->internal_donotuse).currentOffset = uVar2 + inputSize;
            (LZ4_stream->internal_donotuse).tableType = 2;
            local_88 = (ulong *)source;
            if (0xc < inputSize) {
              lVar5 = (long)source - (ulong)uVar2;
              puVar31 = (ulong *)(puVar27 + -5);
              lVar30 = (long)piVar20 + (uVar25 - uVar2);
              *(uint *)((long)LZ4_stream +
                       ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar2;
              puVar7 = (ulong *)(source + 1);
              uVar26 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
              puVar47 = (ulong *)(puVar27 + -0xc);
              iVar23 = 0;
              piVar46 = (int *)source;
              do {
                iVar14 = 1;
                iVar22 = iVar3 << 6;
                while( true ) {
                  puVar28 = (ulong *)((long)iVar14 + (long)puVar7);
                  iVar12 = (int)puVar7;
                  iVar14 = (int)lVar5;
                  if (puVar27 + -0xb < puVar28) {
                    iVar13 = 2;
                  }
                  else {
                    uVar29 = iVar12 - iVar14;
                    uVar15 = *(uint *)((long)LZ4_stream + uVar26 * 4);
                    lVar41 = lVar5;
                    if (uVar15 < uVar2) {
                      lVar41 = lVar30;
                    }
                    piVar4 = (int *)(lVar41 + (ulong)uVar15);
                    piVar46 = (int *)source;
                    if (uVar15 < uVar2) {
                      piVar46 = piVar20;
                    }
                    uVar49 = *puVar28 * -0x30e4432345000000 >> 0x34;
                    *(uint *)((long)LZ4_stream + uVar26 * 4) = uVar29;
                    iVar13 = 8;
                    uVar26 = uVar49;
                    if ((uVar2 - uVar16 <= uVar15) && (uVar29 <= uVar15 + 0xffff)) {
                      if (*piVar4 == (int)*puVar7) {
                        iVar23 = uVar29 - uVar15;
                        iVar13 = 7;
                      }
                      else {
                        iVar13 = 0;
                      }
                    }
                  }
                  if ((iVar13 != 0) && (iVar13 != 8)) break;
                  iVar14 = iVar22 >> 6;
                  iVar22 = iVar22 + 1;
                  puVar7 = puVar28;
                }
                if (iVar13 == 7) {
                  iVar13 = 0;
                }
                puVar28 = local_f8;
                if (iVar13 == 0) {
                  uVar29 = iVar12 - (int)local_88;
                  lVar41 = 0;
                  cVar1 = (char)puVar7 * '\x10' + (char)local_88 * -0x10;
                  uVar15 = uVar29 - 0xf;
                  do {
                    uVar42 = uVar15;
                    cVar34 = cVar1;
                    lVar37 = lVar41;
                    piVar38 = (int *)((long)piVar4 + lVar37);
                    puVar43 = (ulong *)((long)puVar7 + lVar37);
                    if ((piVar38 <= piVar46) || (puVar43 <= local_88)) break;
                    lVar41 = lVar37 + -1;
                    cVar1 = cVar34 + -0x10;
                    uVar15 = uVar42 - 1;
                  } while (*(char *)((long)puVar7 + lVar37 + -1) ==
                           *(char *)((long)piVar4 + lVar37 + -1));
                  iVar22 = (int)lVar37;
                  uVar49 = (ulong)(uint)((iVar12 - (int)local_88) + iVar22);
                  puVar28 = (ulong *)((long)local_f8 + 1);
                  pcVar24 = (char *)((long)local_f8 +
                                    ((ulong)uVar29 + lVar37 & 0xffffffff) / 0xff + uVar49 + 9);
                  if (pcVar6 < pcVar24) {
                    iVar13 = 1;
                  }
                  else {
                    if ((uint)((ulong)uVar29 + lVar37) < 0xf) {
                      *(char *)local_f8 = cVar34;
                      puVar7 = puVar28;
                    }
                    else {
                      uVar39 = (ulong)(uVar29 - 0xf) + lVar37;
                      *(char *)local_f8 = -0x10;
                      if (0xfe < (int)uVar39) {
                        if (0x1fc < (int)uVar42) {
                          uVar42 = 0x1fd;
                        }
                        uVar15 = (uVar29 - uVar42) + iVar22 + 0xef;
                        uVar39 = (ulong)uVar15 / 0xff;
                        memset(puVar28,0xff,(ulong)(uVar15 / 0xff + 1));
                        puVar28 = (ulong *)((long)local_f8 + uVar39 + 2);
                        uVar39 = (ulong)((uVar29 - 0x10e) + iVar22 + (int)uVar39 * -0xff);
                      }
                      *(char *)puVar28 = (char)uVar39;
                      puVar7 = (ulong *)((long)puVar28 + 1);
                    }
                    puVar28 = (ulong *)(uVar49 + (long)puVar7);
                    puVar8 = local_88;
                    do {
                      *puVar7 = *puVar8;
                      puVar7 = puVar7 + 1;
                      puVar8 = puVar8 + 1;
                    } while (puVar7 < puVar28);
                    iVar13 = 0;
                  }
                  puVar7 = puVar43;
                  piVar4 = piVar38;
                  if (pcVar24 <= pcVar6) {
                    do {
                      *(short *)puVar28 = (short)iVar23;
                      if (piVar46 == piVar20) {
                        puVar7 = (ulong *)((long)piVar20 + (uVar25 - (long)piVar38) + (long)puVar43)
                        ;
                        if (puVar31 < puVar7) {
                          puVar7 = puVar31;
                        }
                        puVar17 = (ulong *)((long)puVar43 + 4);
                        puVar8 = (ulong *)(piVar38 + 1);
                        puVar18 = puVar17;
                        puVar40 = puVar8;
                        if (puVar17 < (ulong *)((long)puVar7 - 7U)) {
                          uVar39 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)(piVar38 + 1);
                          uVar49 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                            }
                          }
                          uVar49 = uVar49 >> 3 & 0x1fffffff;
                          puVar18 = (ulong *)((long)puVar43 + 0xc);
                          puVar40 = (ulong *)(piVar38 + 3);
                          if (*(ulong *)(piVar38 + 1) == *(ulong *)((long)puVar43 + 4))
                          goto LAB_00112d3b;
                        }
                        else {
LAB_00112d3b:
                          do {
                            puVar8 = puVar40;
                            if ((ulong *)((long)puVar7 - 7U) <= puVar18) {
                              if ((puVar18 < (ulong *)((long)puVar7 - 3U)) &&
                                 ((int)*puVar8 == (int)*puVar18)) {
                                puVar18 = (ulong *)((long)puVar18 + 4);
                                puVar8 = (ulong *)((long)puVar8 + 4);
                              }
                              if ((puVar18 < (ulong *)((long)puVar7 - 1U)) &&
                                 ((short)*puVar8 == (short)*puVar18)) {
                                puVar18 = (ulong *)((long)puVar18 + 2);
                                puVar8 = (ulong *)((long)puVar8 + 2);
                              }
                              if (puVar18 < puVar7) {
                                uVar49 = *puVar8;
                                puVar8 = (ulong *)CONCAT71((int7)((ulong)puVar8 >> 8),(char)uVar49);
                                puVar18 = (ulong *)((long)puVar18 +
                                                   (ulong)((char)uVar49 == (char)*puVar18));
                              }
                              uVar49 = (ulong)(uint)((int)puVar18 - (int)puVar17);
                              goto LAB_00112d7b;
                            }
                            uVar49 = *puVar8;
                            uVar39 = *puVar18;
                            uVar35 = uVar39 ^ uVar49;
                            uVar36 = 0;
                            if (uVar35 != 0) {
                              for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                              }
                            }
                            iVar22 = (int)puVar18;
                            puVar8 = puVar8 + 1;
                            puVar18 = puVar18 + 1;
                            puVar40 = puVar8;
                          } while (uVar49 == uVar39);
                          uVar49 = (ulong)((((uint)(uVar36 >> 3) & 0x1fffffff) + iVar22) -
                                          (int)puVar17);
                        }
LAB_00112d7b:
                        uVar15 = (uint)uVar49;
                        puVar43 = (ulong *)((long)puVar43 + uVar49 + 4);
                        if (puVar43 == puVar7) {
                          puVar18 = puVar7;
                          puVar17 = (ulong *)source;
                          if (puVar7 < puVar47) {
                            uVar49 = *(ulong *)source;
                            uVar39 = *puVar7;
                            uVar36 = 0;
                            if ((uVar39 ^ uVar49) != 0) {
                              for (; ((uVar39 ^ uVar49) >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                              }
                            }
                            puVar8 = (ulong *)(uVar36 >> 3 & 0x1fffffff);
                            uVar29 = (uint)puVar8;
                            if (uVar49 == uVar39) {
                              puVar17 = (ulong *)(source + (ulong)(uVar49 == uVar39) * 8);
                              puVar18 = puVar7 + (uVar49 == uVar39);
                              goto LAB_00112de2;
                            }
                          }
                          else {
LAB_00112de2:
                            do {
                              if (puVar47 <= puVar18) {
                                if ((puVar18 < puVar27 + -8) && ((int)*puVar17 == (int)*puVar18)) {
                                  puVar18 = (ulong *)((long)puVar18 + 4);
                                  puVar17 = (ulong *)((long)puVar17 + 4);
                                }
                                if ((puVar18 < puVar27 + -6) && ((short)*puVar17 == (short)*puVar18)
                                   ) {
                                  puVar18 = (ulong *)((long)puVar18 + 2);
                                  puVar17 = (ulong *)((long)puVar17 + 2);
                                }
                                if (puVar18 < puVar31) {
                                  puVar18 = (ulong *)((long)puVar18 +
                                                     (ulong)((char)*puVar17 == (char)*puVar18));
                                }
                                uVar29 = (int)puVar18 - (int)puVar7;
                                break;
                              }
                              uVar49 = *puVar17;
                              uVar36 = *puVar18 ^ uVar49;
                              uVar39 = 0;
                              if (uVar36 != 0) {
                                for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                                }
                              }
                              puVar40 = (ulong *)((uVar39 >> 3 & 0x1fffffff) + (long)puVar18);
                              puVar17 = puVar17 + 1;
                              bVar50 = uVar49 == *puVar18;
                              puVar18 = puVar18 + 1;
                              if (!bVar50) {
                                puVar18 = puVar40;
                              }
                              puVar8 = (ulong *)((ulong)puVar8 & 0xffffffff);
                              if (!bVar50) {
                                puVar8 = (ulong *)(ulong)(uint)((int)puVar40 - (int)puVar7);
                              }
                              uVar29 = (uint)puVar8;
                            } while (bVar50);
                          }
                          uVar15 = uVar15 + uVar29;
                          puVar43 = (ulong *)((long)puVar43 + (ulong)uVar29);
                        }
                      }
                      else {
                        puVar8 = (ulong *)((long)puVar43 + 4);
                        puVar7 = (ulong *)(piVar38 + 1);
                        puVar17 = puVar8;
                        if (puVar8 < puVar47) {
                          uVar39 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)(piVar38 + 1);
                          uVar49 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                            }
                          }
                          uVar49 = uVar49 >> 3 & 0x1fffffff;
                          puVar17 = (ulong *)((long)puVar43 + 0xc);
                          puVar7 = (ulong *)(piVar38 + 3);
                          if (*(ulong *)(piVar38 + 1) == *(ulong *)((long)puVar43 + 4))
                          goto LAB_00112c88;
                        }
                        else {
LAB_00112c88:
                          do {
                            if (puVar47 <= puVar17) {
                              if ((puVar17 < puVar27 + -8) && ((int)*puVar7 == (int)*puVar17)) {
                                puVar17 = (ulong *)((long)puVar17 + 4);
                                puVar7 = (ulong *)((long)puVar7 + 4);
                              }
                              if ((puVar17 < puVar27 + -6) && ((short)*puVar7 == (short)*puVar17)) {
                                puVar17 = (ulong *)((long)puVar17 + 2);
                                puVar7 = (ulong *)((long)puVar7 + 2);
                              }
                              if (puVar17 < puVar31) {
                                puVar17 = (ulong *)((long)puVar17 +
                                                   (ulong)((char)*puVar7 == (char)*puVar17));
                              }
                              uVar49 = (ulong)(uint)((int)puVar17 - (int)puVar8);
                              goto LAB_00112cc3;
                            }
                            uVar49 = *puVar7;
                            uVar39 = *puVar17;
                            uVar35 = uVar39 ^ uVar49;
                            uVar36 = 0;
                            if (uVar35 != 0) {
                              for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                              }
                            }
                            iVar22 = (int)puVar17;
                            puVar7 = puVar7 + 1;
                            puVar17 = puVar17 + 1;
                          } while (uVar49 == uVar39);
                          uVar49 = (ulong)((((uint)(uVar36 >> 3) & 0x1fffffff) + iVar22) -
                                          (int)puVar8);
                        }
LAB_00112cc3:
                        uVar15 = (uint)uVar49;
                        puVar43 = (ulong *)((long)puVar43 + uVar49 + 4);
                      }
                      puVar8 = (ulong *)((long)puVar28 + 2);
                      pcVar24 = (char *)((long)puVar28 + (ulong)(uVar15 + 0xf0) / 0xff + 8);
                      if (pcVar24 <= pcVar6) {
                        if (uVar15 < 0xf) {
                          *(char *)local_f8 = (char)*local_f8 + (char)uVar15;
                        }
                        else {
                          *(char *)local_f8 = (char)*local_f8 + '\x0f';
                          uVar29 = uVar15 - 0xf;
                          *(undefined4 *)puVar8 = 0xffffffff;
                          if (0x3fb < uVar29) {
                            uVar15 = uVar15 - 0x40b;
                            memset((char *)((long)puVar28 + 6),0xff,
                                   (ulong)((uVar15 / 0x3fc) * 4 + 4));
                            uVar29 = uVar15 % 0x3fc;
                            puVar8 = (ulong *)((long)puVar28 + (ulong)((uVar15 / 0x3fc) * 4) + 6);
                          }
                          pcVar9 = (char *)((long)puVar8 + (ulong)uVar29 / 0xff);
                          puVar8 = (ulong *)(pcVar9 + 1);
                          *pcVar9 = (char)((ulong)uVar29 * 0x8080808081 >> 0x27);
                        }
                      }
                      puVar7 = puVar43;
                      piVar4 = piVar38;
                      puVar28 = puVar8;
                      if (pcVar6 < pcVar24) {
                        iVar13 = 1;
                        goto LAB_00113135;
                      }
                      local_88 = puVar43;
                      if (puVar27 + -0xb <= puVar43) {
                        iVar13 = 3;
                        goto LAB_00113135;
                      }
                      *(int *)((long)LZ4_stream +
                              ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34)
                              * 4) = ((int)puVar43 + -2) - iVar14;
                      uVar49 = *puVar43 * -0x30e4432345000000 >> 0x34;
                      uVar29 = (int)puVar43 - iVar14;
                      uVar15 = *(uint *)((long)LZ4_stream + uVar49 * 4);
                      lVar41 = lVar5;
                      if (uVar15 < uVar2) {
                        lVar41 = lVar30;
                      }
                      piVar38 = (int *)((ulong)uVar15 + lVar41);
                      piVar46 = (int *)source;
                      if (uVar15 < uVar2) {
                        piVar46 = piVar20;
                      }
                      *(uint *)((long)LZ4_stream + uVar49 * 4) = uVar29;
                      bVar50 = true;
                      if (((uVar2 - uVar16 <= uVar15) && (uVar29 <= uVar15 + 0xffff)) &&
                         (*piVar38 == (int)*puVar43)) {
                        *(char *)puVar8 = '\0';
                        iVar23 = uVar29 - uVar15;
                        bVar50 = false;
                        puVar28 = (ulong *)((long)puVar8 + 1);
                        local_f8 = puVar8;
                      }
                    } while (!bVar50);
                    uVar26 = (ulong)(*(long *)((long)puVar43 + 1) * -0x30e4432345000000) >> 0x34;
                    iVar13 = 0;
                    puVar7 = (ulong *)((long)puVar43 + 1);
                    piVar4 = piVar38;
                  }
                }
LAB_00113135:
                local_f8 = puVar28;
              } while (iVar13 == 0);
              dest = (char *)local_f8;
              if (1 < iVar13 - 2U) goto LAB_00115b2b;
            }
            uVar25 = (long)puVar27 - (long)local_88;
            pcVar24 = (char *)((long)dest + (uVar25 + 0xf0) / 0xff + uVar25 + 1);
            if (pcVar24 <= pcVar6) {
              if (uVar25 < 0xf) {
                *dest = (char)uVar25 << 4;
              }
              else {
                uVar26 = uVar25 - 0xf;
                *dest = -0x10;
                puVar31 = (ulong *)((long)dest + 1);
                if (0xfe < uVar26) {
                  uVar26 = (uVar25 - 0x10e) / 0xff;
                  memset(puVar31,0xff,uVar26 + 1);
                  puVar31 = (ulong *)((long)dest + uVar26 + 2);
                  uVar26 = (uVar25 + uVar26 * -0xff) - 0x10e;
                }
                *(char *)puVar31 = (char)uVar26;
                dest = (char *)puVar31;
              }
              memcpy((char *)((long)dest + 1),local_88,uVar25);
              dest = (char *)((long)dest + uVar25 + 1);
            }
            iVar3 = 0;
            if (pcVar24 <= pcVar6) {
              iVar3 = (int)dest - iVar44;
            }
            goto LAB_00115c57;
          }
          goto LAB_00113a18;
        }
      }
      if ((uint)inputSize < 0x7e000001) {
        uVar2 = (LZ4_stream->internal_donotuse).currentOffset;
        piVar20 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        pcVar6 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar16 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar2 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        if (0xc < inputSize) {
          lVar5 = (long)source - (ulong)uVar2;
          puVar31 = (ulong *)(puVar27 + -5);
          lVar30 = (long)piVar20 + (uVar25 - uVar2);
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar2;
          puVar7 = (ulong *)(source + 1);
          uVar26 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
          puVar47 = (ulong *)(puVar27 + -0xc);
          iVar23 = 0;
          piVar4 = (int *)source;
          do {
            iVar14 = 1;
            iVar22 = iVar3 << 6;
            while( true ) {
              puVar28 = (ulong *)((long)iVar14 + (long)puVar7);
              iVar12 = (int)puVar7;
              iVar14 = (int)lVar5;
              if (puVar27 + -0xb < puVar28) {
                iVar13 = 2;
              }
              else {
                uVar15 = iVar12 - iVar14;
                uVar16 = *(uint *)((long)LZ4_stream + uVar26 * 4);
                lVar41 = lVar5;
                if (uVar16 < uVar2) {
                  lVar41 = lVar30;
                }
                local_d8 = (int *)(lVar41 + (ulong)uVar16);
                piVar4 = (int *)source;
                if (uVar16 < uVar2) {
                  piVar4 = piVar20;
                }
                uVar49 = *puVar28 * -0x30e4432345000000 >> 0x34;
                *(uint *)((long)LZ4_stream + uVar26 * 4) = uVar15;
                iVar13 = 8;
                uVar26 = uVar49;
                if (uVar15 <= uVar16 + 0xffff) {
                  if (*local_d8 == (int)*puVar7) {
                    iVar23 = uVar15 - uVar16;
                    iVar13 = 7;
                  }
                  else {
                    iVar13 = 0;
                  }
                }
              }
              if ((iVar13 != 0) && (iVar13 != 8)) break;
              iVar14 = iVar22 >> 6;
              iVar22 = iVar22 + 1;
              puVar7 = puVar28;
            }
            if (iVar13 == 7) {
              iVar13 = 0;
            }
            puVar28 = local_f8;
            if (iVar13 == 0) {
              uVar15 = iVar12 - (int)local_e0;
              lVar41 = 0;
              cVar1 = (char)puVar7 * '\x10' + (char)local_e0 * -0x10;
              uVar16 = uVar15 - 0xf;
              do {
                uVar29 = uVar16;
                cVar34 = cVar1;
                lVar37 = lVar41;
                piVar46 = (int *)((long)local_d8 + lVar37);
                puVar43 = (ulong *)((long)puVar7 + lVar37);
                if ((piVar46 <= piVar4) || (puVar43 <= local_e0)) break;
                lVar41 = lVar37 + -1;
                cVar1 = cVar34 + -0x10;
                uVar16 = uVar29 - 1;
              } while (*(char *)((long)puVar7 + lVar37 + -1) ==
                       *(char *)((long)local_d8 + lVar37 + -1));
              iVar22 = (int)lVar37;
              uVar49 = (ulong)(uint)((iVar12 - (int)local_e0) + iVar22);
              puVar28 = (ulong *)((long)local_f8 + 1);
              pcVar24 = (char *)((long)local_f8 +
                                ((ulong)uVar15 + lVar37 & 0xffffffff) / 0xff + uVar49 + 9);
              if (pcVar6 < pcVar24) {
                iVar13 = 1;
              }
              else {
                if ((uint)((ulong)uVar15 + lVar37) < 0xf) {
                  *(char *)local_f8 = cVar34;
                  puVar7 = puVar28;
                }
                else {
                  uVar39 = (ulong)(uVar15 - 0xf) + lVar37;
                  *(char *)local_f8 = -0x10;
                  if (0xfe < (int)uVar39) {
                    if (0x1fc < (int)uVar29) {
                      uVar29 = 0x1fd;
                    }
                    uVar16 = (uVar15 - uVar29) + iVar22 + 0xef;
                    uVar39 = (ulong)uVar16 / 0xff;
                    memset(puVar28,0xff,(ulong)(uVar16 / 0xff + 1));
                    puVar28 = (ulong *)((long)local_f8 + uVar39 + 2);
                    uVar39 = (ulong)((uVar15 - 0x10e) + iVar22 + (int)uVar39 * -0xff);
                  }
                  *(char *)puVar28 = (char)uVar39;
                  puVar7 = (ulong *)((long)puVar28 + 1);
                }
                puVar28 = (ulong *)(uVar49 + (long)puVar7);
                puVar8 = local_e0;
                do {
                  *puVar7 = *puVar8;
                  puVar7 = puVar7 + 1;
                  puVar8 = puVar8 + 1;
                } while (puVar7 < puVar28);
                iVar13 = 0;
              }
              puVar7 = puVar43;
              local_d8 = piVar46;
              if (pcVar24 <= pcVar6) {
                do {
                  *(short *)puVar28 = (short)iVar23;
                  if (piVar4 == piVar20) {
                    puVar7 = (ulong *)((long)piVar20 + (uVar25 - (long)local_d8) + (long)puVar43);
                    if (puVar31 < puVar7) {
                      puVar7 = puVar31;
                    }
                    puVar8 = (ulong *)((long)puVar43 + 4);
                    puVar17 = (ulong *)(local_d8 + 1);
                    puVar18 = puVar8;
                    puVar40 = puVar17;
                    if (puVar8 < (ulong *)((long)puVar7 - 7U)) {
                      uVar39 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)(local_d8 + 1);
                      uVar49 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                        }
                      }
                      uVar49 = uVar49 >> 3 & 0x1fffffff;
                      puVar18 = (ulong *)((long)puVar43 + 0xc);
                      puVar40 = (ulong *)(local_d8 + 3);
                      if (*(ulong *)(local_d8 + 1) == *(ulong *)((long)puVar43 + 4))
                      goto LAB_001146fe;
                    }
                    else {
LAB_001146fe:
                      do {
                        puVar17 = puVar40;
                        if ((ulong *)((long)puVar7 - 7U) <= puVar18) {
                          if ((puVar18 < (ulong *)((long)puVar7 - 3U)) &&
                             ((int)*puVar17 == (int)*puVar18)) {
                            puVar18 = (ulong *)((long)puVar18 + 4);
                            puVar17 = (ulong *)((long)puVar17 + 4);
                          }
                          if ((puVar18 < (ulong *)((long)puVar7 - 1U)) &&
                             ((short)*puVar17 == (short)*puVar18)) {
                            puVar18 = (ulong *)((long)puVar18 + 2);
                            puVar17 = (ulong *)((long)puVar17 + 2);
                          }
                          if (puVar18 < puVar7) {
                            uVar49 = *puVar17;
                            puVar17 = (ulong *)CONCAT71((int7)((ulong)puVar17 >> 8),(char)uVar49);
                            puVar18 = (ulong *)((long)puVar18 +
                                               (ulong)((char)uVar49 == (char)*puVar18));
                          }
                          uVar49 = (ulong)(uint)((int)puVar18 - (int)puVar8);
                          goto LAB_0011473e;
                        }
                        uVar49 = *puVar17;
                        uVar39 = *puVar18;
                        uVar35 = uVar39 ^ uVar49;
                        uVar36 = 0;
                        if (uVar35 != 0) {
                          for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                          }
                        }
                        iVar22 = (int)puVar18;
                        puVar17 = puVar17 + 1;
                        puVar18 = puVar18 + 1;
                        puVar40 = puVar17;
                      } while (uVar49 == uVar39);
                      uVar49 = (ulong)((((uint)(uVar36 >> 3) & 0x1fffffff) + iVar22) - (int)puVar8);
                    }
LAB_0011473e:
                    uVar16 = (uint)uVar49;
                    puVar43 = (ulong *)((long)puVar43 + uVar49 + 4);
                    if (puVar43 == puVar7) {
                      puVar18 = puVar7;
                      puVar8 = (ulong *)source;
                      if (puVar7 < puVar47) {
                        uVar49 = *(ulong *)source;
                        uVar39 = *puVar7;
                        uVar36 = 0;
                        if ((uVar39 ^ uVar49) != 0) {
                          for (; ((uVar39 ^ uVar49) >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                          }
                        }
                        puVar17 = (ulong *)(uVar36 >> 3 & 0x1fffffff);
                        uVar15 = (uint)puVar17;
                        if (uVar49 == uVar39) {
                          puVar8 = (ulong *)(source + (ulong)(uVar49 == uVar39) * 8);
                          puVar18 = puVar7 + (uVar49 == uVar39);
                          goto LAB_0011493a;
                        }
                      }
                      else {
LAB_0011493a:
                        do {
                          if (puVar47 <= puVar18) {
                            if ((puVar18 < puVar27 + -8) && ((int)*puVar8 == (int)*puVar18)) {
                              puVar18 = (ulong *)((long)puVar18 + 4);
                              puVar8 = (ulong *)((long)puVar8 + 4);
                            }
                            if ((puVar18 < puVar27 + -6) && ((short)*puVar8 == (short)*puVar18)) {
                              puVar18 = (ulong *)((long)puVar18 + 2);
                              puVar8 = (ulong *)((long)puVar8 + 2);
                            }
                            if (puVar18 < puVar31) {
                              puVar18 = (ulong *)((long)puVar18 +
                                                 (ulong)((char)*puVar8 == (char)*puVar18));
                            }
                            uVar15 = (int)puVar18 - (int)puVar7;
                            break;
                          }
                          uVar49 = *puVar8;
                          uVar36 = *puVar18 ^ uVar49;
                          uVar39 = 0;
                          if (uVar36 != 0) {
                            for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                            }
                          }
                          puVar40 = (ulong *)((uVar39 >> 3 & 0x1fffffff) + (long)puVar18);
                          puVar8 = puVar8 + 1;
                          bVar50 = uVar49 == *puVar18;
                          puVar18 = puVar18 + 1;
                          if (!bVar50) {
                            puVar18 = puVar40;
                          }
                          puVar17 = (ulong *)((ulong)puVar17 & 0xffffffff);
                          if (!bVar50) {
                            puVar17 = (ulong *)(ulong)(uint)((int)puVar40 - (int)puVar7);
                          }
                          uVar15 = (uint)puVar17;
                        } while (bVar50);
                      }
                      uVar16 = uVar16 + uVar15;
                      puVar43 = (ulong *)((long)puVar43 + (ulong)uVar15);
                    }
                  }
                  else {
                    puVar7 = (ulong *)((long)puVar43 + 4);
                    puVar8 = (ulong *)(local_d8 + 1);
                    puVar17 = puVar7;
                    if (puVar7 < puVar47) {
                      uVar39 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)(local_d8 + 1);
                      uVar49 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                        }
                      }
                      uVar49 = uVar49 >> 3 & 0x1fffffff;
                      puVar17 = (ulong *)((long)puVar43 + 0xc);
                      puVar8 = (ulong *)(local_d8 + 3);
                      if (*(ulong *)(local_d8 + 1) == *(ulong *)((long)puVar43 + 4))
                      goto LAB_00114653;
                    }
                    else {
LAB_00114653:
                      do {
                        if (puVar47 <= puVar17) {
                          if ((puVar17 < puVar27 + -8) && ((int)*puVar8 == (int)*puVar17)) {
                            puVar17 = (ulong *)((long)puVar17 + 4);
                            puVar8 = (ulong *)((long)puVar8 + 4);
                          }
                          if ((puVar17 < puVar27 + -6) && ((short)*puVar8 == (short)*puVar17)) {
                            puVar17 = (ulong *)((long)puVar17 + 2);
                            puVar8 = (ulong *)((long)puVar8 + 2);
                          }
                          if (puVar17 < puVar31) {
                            puVar17 = (ulong *)((long)puVar17 +
                                               (ulong)((char)*puVar8 == (char)*puVar17));
                          }
                          uVar49 = (ulong)(uint)((int)puVar17 - (int)puVar7);
                          break;
                        }
                        uVar39 = *puVar8;
                        uVar36 = *puVar17;
                        uVar35 = uVar36 ^ uVar39;
                        uVar49 = 0;
                        if (uVar35 != 0) {
                          for (; (uVar35 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                          }
                        }
                        uVar49 = (ulong)((((uint)(uVar49 >> 3) & 0x1fffffff) + (int)puVar17) -
                                        (int)puVar7);
                        puVar8 = puVar8 + 1;
                        puVar17 = puVar17 + 1;
                      } while (uVar39 == uVar36);
                    }
                    uVar16 = (uint)uVar49;
                    puVar43 = (ulong *)((long)puVar43 + uVar49 + 4);
                  }
                  puVar8 = (ulong *)((long)puVar28 + 2);
                  pcVar24 = (char *)((long)puVar28 + (ulong)(uVar16 + 0xf0) / 0xff + 8);
                  if (pcVar24 <= pcVar6) {
                    if (uVar16 < 0xf) {
                      *(char *)local_f8 = (char)*local_f8 + (char)uVar16;
                    }
                    else {
                      *(char *)local_f8 = (char)*local_f8 + '\x0f';
                      uVar15 = uVar16 - 0xf;
                      *(undefined4 *)puVar8 = 0xffffffff;
                      if (0x3fb < uVar15) {
                        uVar16 = uVar16 - 0x40b;
                        memset((char *)((long)puVar28 + 6),0xff,(ulong)((uVar16 / 0x3fc) * 4 + 4));
                        uVar15 = uVar16 % 0x3fc;
                        puVar8 = (ulong *)((long)puVar28 + (ulong)((uVar16 / 0x3fc) * 4) + 6);
                      }
                      pcVar9 = (char *)((long)puVar8 + (ulong)uVar15 / 0xff);
                      puVar8 = (ulong *)(pcVar9 + 1);
                      *pcVar9 = (char)((ulong)uVar15 * 0x8080808081 >> 0x27);
                    }
                  }
                  puVar7 = puVar43;
                  puVar28 = puVar8;
                  if (pcVar6 < pcVar24) {
                    iVar13 = 1;
                    goto LAB_00114ad3;
                  }
                  local_e0 = puVar43;
                  if (puVar27 + -0xb <= puVar43) {
                    iVar13 = 3;
                    goto LAB_00114ad3;
                  }
                  *(int *)((long)LZ4_stream +
                          ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34) * 4
                          ) = ((int)puVar43 + -2) - iVar14;
                  uVar49 = *puVar43 * -0x30e4432345000000 >> 0x34;
                  uVar15 = (int)puVar43 - iVar14;
                  uVar16 = *(uint *)((long)LZ4_stream + uVar49 * 4);
                  lVar41 = lVar5;
                  if (uVar16 < uVar2) {
                    lVar41 = lVar30;
                  }
                  local_d8 = (int *)((ulong)uVar16 + lVar41);
                  piVar4 = (int *)source;
                  if (uVar16 < uVar2) {
                    piVar4 = piVar20;
                  }
                  *(uint *)((long)LZ4_stream + uVar49 * 4) = uVar15;
                  bVar50 = true;
                  if ((uVar15 <= uVar16 + 0xffff) && (*local_d8 == (int)*puVar43)) {
                    *(char *)puVar8 = '\0';
                    iVar23 = uVar15 - uVar16;
                    bVar50 = false;
                    puVar28 = (ulong *)((long)puVar8 + 1);
                    local_f8 = puVar8;
                  }
                } while (!bVar50);
                uVar26 = (ulong)(*(long *)((long)puVar43 + 1) * -0x30e4432345000000) >> 0x34;
                iVar13 = 0;
                puVar7 = (ulong *)((long)puVar43 + 1);
              }
            }
LAB_00114ad3:
            local_f8 = puVar28;
          } while (iVar13 == 0);
          dest = (char *)local_f8;
          if (1 < iVar13 - 2U) goto LAB_00115b2b;
        }
        uVar25 = (long)puVar27 - (long)local_e0;
        pcVar24 = (char *)((long)dest + (uVar25 + 0xf0) / 0xff + uVar25 + 1);
        if (pcVar24 <= pcVar6) {
          if (uVar25 < 0xf) {
            *dest = (char)uVar25 << 4;
          }
          else {
            uVar26 = uVar25 - 0xf;
            *dest = -0x10;
            puVar31 = (ulong *)((long)dest + 1);
            if (0xfe < uVar26) {
              uVar26 = (uVar25 - 0x10e) / 0xff;
              memset(puVar31,0xff,uVar26 + 1);
              puVar31 = (ulong *)((long)dest + uVar26 + 2);
              uVar26 = (uVar25 + uVar26 * -0xff) - 0x10e;
            }
            *(char *)puVar31 = (char)uVar26;
            dest = (char *)puVar31;
          }
          memcpy((char *)((long)dest + 1),local_e0,uVar25);
          dest = (char *)((long)dest + uVar25 + 1);
        }
        iVar3 = 0;
        if (pcVar24 <= pcVar6) {
          iVar3 = (int)dest - iVar44;
        }
        goto LAB_00115c57;
      }
    }
    else {
      if (0x1000 < inputSize) {
        memcpy(LZ4_stream,__src,0x4020);
        if (0x7e000000 < (uint)inputSize) {
          iVar3 = 0;
          goto LAB_00115c57;
        }
        uVar16 = (LZ4_stream->internal_donotuse).currentOffset;
        lVar30 = (long)source - (ulong)uVar16;
        piVar20 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        uVar2 = (LZ4_stream->internal_donotuse).dictSize;
        puVar31 = (ulong *)(puVar27 + -5);
        lVar5 = (long)piVar20 + ((ulong)uVar2 - (ulong)uVar16);
        pcVar6 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = inputSize + uVar2;
        (LZ4_stream->internal_donotuse).currentOffset = uVar16 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar16;
        puVar7 = (ulong *)(source + 1);
        uVar25 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        puVar47 = (ulong *)(puVar27 + -0xc);
        iVar23 = 0;
        piVar4 = (int *)source;
        local_f0 = (ulong *)dest;
        local_c8 = (ulong *)source;
        do {
          iVar14 = 1;
          iVar22 = iVar3 << 6;
          while( true ) {
            puVar28 = (ulong *)((long)iVar14 + (long)puVar7);
            iVar12 = (int)puVar7;
            iVar14 = (int)lVar30;
            if (puVar27 + -0xb < puVar28) {
              iVar13 = 2;
            }
            else {
              uVar29 = iVar12 - iVar14;
              uVar15 = *(uint *)((long)LZ4_stream + uVar25 * 4);
              lVar41 = lVar30;
              if (uVar15 < uVar16) {
                lVar41 = lVar5;
              }
              local_b8 = (long *)(lVar41 + (ulong)uVar15);
              piVar4 = (int *)source;
              if (uVar15 < uVar16) {
                piVar4 = piVar20;
              }
              uVar26 = *puVar28 * -0x30e4432345000000 >> 0x34;
              *(uint *)((long)LZ4_stream + uVar25 * 4) = uVar29;
              iVar13 = 8;
              uVar25 = uVar26;
              if (uVar29 <= uVar15 + 0xffff) {
                if (*(int *)local_b8 == (int)*puVar7) {
                  iVar23 = uVar29 - uVar15;
                  iVar13 = 7;
                }
                else {
                  iVar13 = 0;
                }
              }
            }
            if ((iVar13 != 0) && (iVar13 != 8)) break;
            iVar14 = iVar22 >> 6;
            iVar22 = iVar22 + 1;
            puVar7 = puVar28;
          }
          if (iVar13 == 7) {
            iVar13 = 0;
          }
          puVar28 = local_f0;
          if (iVar13 == 0) {
            uVar29 = iVar12 - (int)local_c8;
            lVar41 = 0;
            cVar1 = (char)puVar7 * '\x10' + (char)local_c8 * -0x10;
            uVar15 = uVar29 - 0xf;
            do {
              uVar42 = uVar15;
              cVar34 = cVar1;
              lVar37 = lVar41;
              piVar46 = (int *)((long)local_b8 + lVar37);
              puVar43 = (ulong *)((long)puVar7 + lVar37);
              if ((piVar46 <= piVar4) || (puVar43 <= local_c8)) break;
              lVar41 = lVar37 + -1;
              cVar1 = cVar34 + -0x10;
              uVar15 = uVar42 - 1;
            } while (*(char *)((long)puVar7 + lVar37 + -1) ==
                     *(char *)((long)local_b8 + lVar37 + -1));
            iVar22 = (int)lVar37;
            uVar26 = (ulong)(uint)((iVar12 - (int)local_c8) + iVar22);
            puVar28 = (ulong *)((long)local_f0 + 1);
            pcVar24 = (char *)((long)local_f0 +
                              ((ulong)uVar29 + lVar37 & 0xffffffff) / 0xff + uVar26 + 9);
            if (pcVar6 < pcVar24) {
              iVar13 = 1;
            }
            else {
              if ((uint)((ulong)uVar29 + lVar37) < 0xf) {
                *(char *)local_f0 = cVar34;
                puVar7 = puVar28;
              }
              else {
                uVar49 = (ulong)(uVar29 - 0xf) + lVar37;
                *(char *)local_f0 = -0x10;
                if (0xfe < (int)uVar49) {
                  if (0x1fc < (int)uVar42) {
                    uVar42 = 0x1fd;
                  }
                  uVar15 = (uVar29 - uVar42) + iVar22 + 0xef;
                  uVar49 = (ulong)uVar15 / 0xff;
                  memset(puVar28,0xff,(ulong)(uVar15 / 0xff + 1));
                  puVar28 = (ulong *)((long)local_f0 + uVar49 + 2);
                  uVar49 = (ulong)((uVar29 - 0x10e) + iVar22 + (int)uVar49 * -0xff);
                }
                *(char *)puVar28 = (char)uVar49;
                puVar7 = (ulong *)((long)puVar28 + 1);
              }
              puVar28 = (ulong *)(uVar26 + (long)puVar7);
              puVar8 = local_c8;
              do {
                *puVar7 = *puVar8;
                puVar7 = puVar7 + 1;
                puVar8 = puVar8 + 1;
              } while (puVar7 < puVar28);
              iVar13 = 0;
            }
            puVar7 = puVar43;
            local_b8 = (long *)piVar46;
            if (pcVar24 <= pcVar6) {
              do {
                *(short *)puVar28 = (short)iVar23;
                if (piVar4 == piVar20) {
                  puVar7 = (ulong *)((long)piVar20 + ((ulong)uVar2 - (long)local_b8) + (long)puVar43
                                    );
                  if (puVar31 < puVar7) {
                    puVar7 = puVar31;
                  }
                  puVar8 = (ulong *)((long)puVar43 + 4);
                  puVar17 = (ulong *)((long)local_b8 + 4);
                  puVar18 = puVar8;
                  puVar40 = puVar17;
                  if (puVar8 < (ulong *)((long)puVar7 - 7U)) {
                    uVar49 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)((long)local_b8 + 4);
                    uVar26 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = uVar26 >> 3 & 0x1fffffff;
                    puVar18 = (ulong *)((long)puVar43 + 0xc);
                    puVar40 = (ulong *)((long)local_b8 + 0xc);
                    if (*(ulong *)((long)local_b8 + 4) == *(ulong *)((long)puVar43 + 4))
                    goto LAB_00113e60;
                  }
                  else {
LAB_00113e60:
                    do {
                      puVar17 = puVar40;
                      if ((ulong *)((long)puVar7 - 7U) <= puVar18) {
                        if ((puVar18 < (ulong *)((long)puVar7 - 3U)) &&
                           ((int)*puVar17 == (int)*puVar18)) {
                          puVar18 = (ulong *)((long)puVar18 + 4);
                          puVar17 = (ulong *)((long)puVar17 + 4);
                        }
                        if ((puVar18 < (ulong *)((long)puVar7 - 1U)) &&
                           ((short)*puVar17 == (short)*puVar18)) {
                          puVar18 = (ulong *)((long)puVar18 + 2);
                          puVar17 = (ulong *)((long)puVar17 + 2);
                        }
                        if (puVar18 < puVar7) {
                          uVar26 = *puVar17;
                          puVar17 = (ulong *)CONCAT71((int7)((ulong)puVar17 >> 8),(char)uVar26);
                          puVar18 = (ulong *)((long)puVar18 +
                                             (ulong)((char)uVar26 == (char)*puVar18));
                        }
                        uVar26 = (ulong)(uint)((int)puVar18 - (int)puVar8);
                        goto LAB_00113e9b;
                      }
                      uVar26 = *puVar17;
                      uVar49 = *puVar18;
                      uVar36 = uVar49 ^ uVar26;
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      iVar22 = (int)puVar18;
                      puVar17 = puVar17 + 1;
                      puVar18 = puVar18 + 1;
                      puVar40 = puVar17;
                    } while (uVar26 == uVar49);
                    uVar26 = (ulong)((((uint)(uVar39 >> 3) & 0x1fffffff) + iVar22) - (int)puVar8);
                  }
LAB_00113e9b:
                  uVar15 = (uint)uVar26;
                  puVar43 = (ulong *)((long)puVar43 + uVar26 + 4);
                  if (puVar43 == puVar7) {
                    puVar18 = puVar7;
                    puVar8 = (ulong *)source;
                    if (puVar7 < puVar47) {
                      uVar26 = *(ulong *)source;
                      uVar49 = *puVar7;
                      uVar39 = 0;
                      if ((uVar49 ^ uVar26) != 0) {
                        for (; ((uVar49 ^ uVar26) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      puVar17 = (ulong *)(uVar39 >> 3 & 0x1fffffff);
                      uVar29 = (uint)puVar17;
                      if (uVar26 == uVar49) {
                        puVar8 = (ulong *)(source + (ulong)(uVar26 == uVar49) * 8);
                        puVar18 = puVar7 + (uVar26 == uVar49);
                        goto LAB_00113f0a;
                      }
                    }
                    else {
LAB_00113f0a:
                      do {
                        if (puVar47 <= puVar18) {
                          if ((puVar18 < puVar27 + -8) && ((int)*puVar8 == (int)*puVar18)) {
                            puVar18 = (ulong *)((long)puVar18 + 4);
                            puVar8 = (ulong *)((long)puVar8 + 4);
                          }
                          if ((puVar18 < puVar27 + -6) && ((short)*puVar8 == (short)*puVar18)) {
                            puVar18 = (ulong *)((long)puVar18 + 2);
                            puVar8 = (ulong *)((long)puVar8 + 2);
                          }
                          if (puVar18 < puVar31) {
                            puVar18 = (ulong *)((long)puVar18 +
                                               (ulong)((char)*puVar8 == (char)*puVar18));
                          }
                          uVar29 = (int)puVar18 - (int)puVar7;
                          break;
                        }
                        uVar26 = *puVar8;
                        uVar39 = *puVar18 ^ uVar26;
                        uVar49 = 0;
                        if (uVar39 != 0) {
                          for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                          }
                        }
                        puVar40 = (ulong *)((uVar49 >> 3 & 0x1fffffff) + (long)puVar18);
                        puVar8 = puVar8 + 1;
                        bVar50 = uVar26 == *puVar18;
                        puVar18 = puVar18 + 1;
                        if (!bVar50) {
                          puVar18 = puVar40;
                        }
                        puVar17 = (ulong *)((ulong)puVar17 & 0xffffffff);
                        if (!bVar50) {
                          puVar17 = (ulong *)(ulong)(uint)((int)puVar40 - (int)puVar7);
                        }
                        uVar29 = (uint)puVar17;
                      } while (bVar50);
                    }
                    uVar15 = uVar15 + uVar29;
                    puVar43 = (ulong *)((long)puVar43 + (ulong)uVar29);
                  }
                }
                else {
                  puVar7 = (ulong *)((long)puVar43 + 4);
                  puVar8 = (ulong *)((long)local_b8 + 4);
                  puVar17 = puVar7;
                  if (puVar7 < puVar47) {
                    uVar49 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)((long)local_b8 + 4);
                    uVar26 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = uVar26 >> 3 & 0x1fffffff;
                    puVar17 = (ulong *)((long)puVar43 + 0xc);
                    puVar8 = (ulong *)((long)local_b8 + 0xc);
                    if (*(ulong *)((long)local_b8 + 4) == *(ulong *)((long)puVar43 + 4))
                    goto LAB_00113dad;
                  }
                  else {
LAB_00113dad:
                    do {
                      if (puVar47 <= puVar17) {
                        if ((puVar17 < puVar27 + -8) && ((int)*puVar8 == (int)*puVar17)) {
                          puVar17 = (ulong *)((long)puVar17 + 4);
                          puVar8 = (ulong *)((long)puVar8 + 4);
                        }
                        if ((puVar17 < puVar27 + -6) && ((short)*puVar8 == (short)*puVar17)) {
                          puVar17 = (ulong *)((long)puVar17 + 2);
                          puVar8 = (ulong *)((long)puVar8 + 2);
                        }
                        if (puVar17 < puVar31) {
                          puVar17 = (ulong *)((long)puVar17 +
                                             (ulong)((char)*puVar8 == (char)*puVar17));
                        }
                        uVar26 = (ulong)(uint)((int)puVar17 - (int)puVar7);
                        goto LAB_00113de8;
                      }
                      uVar26 = *puVar8;
                      uVar49 = *puVar17;
                      uVar36 = uVar49 ^ uVar26;
                      uVar39 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      iVar22 = (int)puVar17;
                      puVar8 = puVar8 + 1;
                      puVar17 = puVar17 + 1;
                    } while (uVar26 == uVar49);
                    uVar26 = (ulong)((((uint)(uVar39 >> 3) & 0x1fffffff) + iVar22) - (int)puVar7);
                  }
LAB_00113de8:
                  uVar15 = (uint)uVar26;
                  puVar43 = (ulong *)((long)puVar43 + uVar26 + 4);
                }
                puVar8 = (ulong *)((long)puVar28 + 2);
                pcVar24 = (char *)((long)puVar28 + (ulong)(uVar15 + 0xf0) / 0xff + 8);
                if (pcVar24 <= pcVar6) {
                  if (uVar15 < 0xf) {
                    *(char *)local_f0 = (char)*local_f0 + (char)uVar15;
                  }
                  else {
                    *(char *)local_f0 = (char)*local_f0 + '\x0f';
                    uVar29 = uVar15 - 0xf;
                    *(undefined4 *)puVar8 = 0xffffffff;
                    if (0x3fb < uVar29) {
                      uVar15 = uVar15 - 0x40b;
                      memset((char *)((long)puVar28 + 6),0xff,(ulong)((uVar15 / 0x3fc) * 4 + 4));
                      uVar29 = uVar15 % 0x3fc;
                      puVar8 = (ulong *)((long)puVar28 + (ulong)((uVar15 / 0x3fc) * 4) + 6);
                    }
                    pcVar9 = (char *)((long)puVar8 + (ulong)uVar29 / 0xff);
                    puVar8 = (ulong *)(pcVar9 + 1);
                    *pcVar9 = (char)((ulong)uVar29 * 0x8080808081 >> 0x27);
                  }
                }
                puVar7 = puVar43;
                puVar28 = puVar8;
                if (pcVar6 < pcVar24) {
                  iVar13 = 1;
                  goto LAB_00114241;
                }
                local_c8 = puVar43;
                if (puVar27 + -0xb <= puVar43) {
                  iVar13 = 3;
                  goto LAB_00114241;
                }
                *(int *)((long)LZ4_stream +
                        ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34) * 4)
                     = ((int)puVar43 + -2) - iVar14;
                uVar26 = *puVar43 * -0x30e4432345000000 >> 0x34;
                uVar29 = (int)puVar43 - iVar14;
                uVar15 = *(uint *)((long)LZ4_stream + uVar26 * 4);
                lVar41 = lVar30;
                if (uVar15 < uVar16) {
                  lVar41 = lVar5;
                }
                local_b8 = (long *)((ulong)uVar15 + lVar41);
                piVar4 = (int *)source;
                if (uVar15 < uVar16) {
                  piVar4 = piVar20;
                }
                *(uint *)((long)LZ4_stream + uVar26 * 4) = uVar29;
                bVar50 = true;
                if ((uVar29 <= uVar15 + 0xffff) && (*(int *)local_b8 == (int)*puVar43)) {
                  *(char *)puVar8 = '\0';
                  iVar23 = uVar29 - uVar15;
                  bVar50 = false;
                  puVar28 = (ulong *)((long)puVar8 + 1);
                  local_f0 = puVar8;
                }
              } while (!bVar50);
              uVar25 = (ulong)(*(long *)((long)puVar43 + 1) * -0x30e4432345000000) >> 0x34;
              iVar13 = 0;
              puVar7 = (ulong *)((long)puVar43 + 1);
            }
          }
LAB_00114241:
          local_f0 = puVar28;
        } while (iVar13 == 0);
        if (iVar13 - 2U < 2) {
          uVar25 = (long)puVar27 - (long)local_c8;
          pcVar24 = (char *)((long)local_f0 + (uVar25 + 0xf0) / 0xff + uVar25 + 1);
          if (pcVar6 < pcVar24) {
            iVar3 = (int)local_f0;
          }
          else {
            if (uVar25 < 0xf) {
              *(char *)local_f0 = (char)uVar25 << 4;
            }
            else {
              uVar26 = uVar25 - 0xf;
              *(char *)local_f0 = -0x10;
              puVar31 = (ulong *)((long)local_f0 + 1);
              if (0xfe < uVar26) {
                uVar49 = (uVar25 - 0x10e) / 0xff;
                memset((ulong *)((long)local_f0 + 1),0xff,uVar49 + 1);
                uVar26 = (uVar49 * -0xff + uVar25) - 0x10e;
                puVar31 = (ulong *)((long)local_f0 + uVar49 + 2);
              }
              local_f0 = puVar31;
              *(char *)local_f0 = (char)uVar26;
            }
            memcpy((char *)((long)local_f0 + 1),local_c8,uVar25);
            iVar3 = (int)local_f0 + (int)uVar25 + 1;
          }
          if (pcVar6 < pcVar24) {
            iVar3 = 0;
          }
          else {
            iVar3 = iVar3 - iVar44;
          }
          goto LAB_00115c57;
        }
LAB_00115b2b:
        iVar3 = 0;
        goto LAB_00115c57;
      }
      if ((uint)inputSize < 0x7e000001) {
        uVar16 = (LZ4_stream->internal_donotuse).currentOffset;
        piVar20 = (int *)__src->dictionary;
        uVar2 = __src->dictSize;
        uVar15 = __src->currentOffset;
        pcVar6 = dest + maxOutputSize;
        LZ4_stream->table[0x802] = 0;
        (LZ4_stream->internal_donotuse).dictSize = inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar16 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        if (0xc < inputSize) {
          lVar30 = (long)source - (ulong)uVar16;
          iVar22 = uVar16 - uVar15;
          puVar31 = (ulong *)(puVar27 + -5);
          lVar5 = (ulong)uVar2 - (ulong)uVar15;
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar16;
          puVar47 = (ulong *)(source + 1);
          uVar25 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
          puVar7 = (ulong *)(puVar27 + -0xc);
          iVar23 = 0;
          local_a0 = (int *)source;
          do {
            iVar12 = 1;
            iVar14 = iVar3 << 6;
            while( true ) {
              puVar28 = (ulong *)((long)iVar12 + (long)puVar47);
              iVar13 = (int)puVar47;
              iVar12 = (int)lVar30;
              if (puVar27 + -0xb < puVar28) {
                iVar11 = 2;
              }
              else {
                uVar15 = *(uint *)((long)LZ4_stream + uVar25 * 4);
                if (uVar15 < uVar16) {
                  uVar15 = iVar22 + __src->hashTable[uVar25];
                  local_d8 = (int *)((long)piVar20 + (ulong)__src->hashTable[uVar25] + lVar5);
                  local_a0 = piVar20;
                }
                else {
                  local_d8 = (int *)((ulong)uVar15 + lVar30);
                  local_a0 = (int *)source;
                }
                uVar29 = iVar13 - iVar12;
                uVar26 = *puVar28 * -0x30e4432345000000 >> 0x34;
                *(uint *)((long)LZ4_stream + uVar25 * 4) = uVar29;
                iVar11 = 8;
                uVar25 = uVar26;
                if (uVar29 <= uVar15 + 0xffff) {
                  if (*local_d8 == (int)*puVar47) {
                    iVar23 = uVar29 - uVar15;
                    iVar11 = 7;
                  }
                  else {
                    iVar11 = 0;
                  }
                }
              }
              if ((iVar11 != 0) && (iVar11 != 8)) break;
              iVar12 = iVar14 >> 6;
              iVar14 = iVar14 + 1;
              puVar47 = puVar28;
            }
            if (iVar11 == 7) {
              iVar11 = 0;
            }
            puVar28 = local_f8;
            if (iVar11 == 0) {
              uVar29 = iVar13 - (int)local_e0;
              lVar41 = 0;
              cVar1 = (char)puVar47 * '\x10' + (char)local_e0 * -0x10;
              uVar15 = uVar29 - 0xf;
              do {
                uVar42 = uVar15;
                cVar34 = cVar1;
                lVar37 = lVar41;
                piVar4 = (int *)((long)local_d8 + lVar37);
                puVar43 = (ulong *)((long)puVar47 + lVar37);
                if ((piVar4 <= local_a0) || (puVar43 <= local_e0)) break;
                lVar41 = lVar37 + -1;
                cVar1 = cVar34 + -0x10;
                uVar15 = uVar42 - 1;
              } while (*(char *)((long)puVar47 + lVar37 + -1) ==
                       *(char *)((long)local_d8 + lVar37 + -1));
              iVar14 = (int)lVar37;
              uVar26 = (ulong)(uint)((iVar13 - (int)local_e0) + iVar14);
              puVar28 = (ulong *)((long)local_f8 + 1);
              pcVar24 = (char *)((long)local_f8 +
                                ((ulong)uVar29 + lVar37 & 0xffffffff) / 0xff + uVar26 + 9);
              if (pcVar6 < pcVar24) {
                iVar11 = 1;
              }
              else {
                if ((uint)((ulong)uVar29 + lVar37) < 0xf) {
                  *(char *)local_f8 = cVar34;
                  puVar47 = puVar28;
                }
                else {
                  uVar49 = (ulong)(uVar29 - 0xf) + lVar37;
                  *(char *)local_f8 = -0x10;
                  if (0xfe < (int)uVar49) {
                    if (0x1fc < (int)uVar42) {
                      uVar42 = 0x1fd;
                    }
                    uVar15 = (uVar29 - uVar42) + iVar14 + 0xef;
                    memset(puVar28,0xff,(ulong)(uVar15 / 0xff + 1));
                    puVar28 = (ulong *)((long)local_f8 + (ulong)uVar15 / 0xff + 2);
                    uVar49 = (ulong)((uVar29 - 0x10e) + iVar14 + uVar15 / 0xff);
                  }
                  *(char *)puVar28 = (char)uVar49;
                  puVar47 = (ulong *)((long)puVar28 + 1);
                }
                puVar28 = (ulong *)(uVar26 + (long)puVar47);
                puVar8 = local_e0;
                do {
                  *puVar47 = *puVar8;
                  puVar47 = puVar47 + 1;
                  puVar8 = puVar8 + 1;
                } while (puVar47 < puVar28);
                iVar11 = 0;
              }
              puVar47 = puVar43;
              local_d8 = piVar4;
              if (pcVar24 <= pcVar6) {
                do {
                  *(short *)puVar28 = (short)iVar23;
                  if (local_a0 == piVar20) {
                    puVar47 = (ulong *)((long)piVar20 + ((ulong)uVar2 - (long)local_d8) +
                                       (long)puVar43);
                    if (puVar31 < puVar47) {
                      puVar47 = puVar31;
                    }
                    puVar17 = (ulong *)((long)puVar43 + 4);
                    puVar8 = (ulong *)(local_d8 + 1);
                    puVar18 = puVar17;
                    puVar40 = puVar8;
                    if (puVar17 < (ulong *)((long)puVar47 - 7U)) {
                      uVar49 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)(local_d8 + 1);
                      uVar26 = 0;
                      if (uVar49 != 0) {
                        for (; (uVar49 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      uVar26 = uVar26 >> 3 & 0x1fffffff;
                      puVar18 = (ulong *)((long)puVar43 + 0xc);
                      puVar40 = (ulong *)(local_d8 + 3);
                      if (*(ulong *)(local_d8 + 1) == *(ulong *)((long)puVar43 + 4))
                      goto LAB_00113609;
                    }
                    else {
LAB_00113609:
                      do {
                        puVar8 = puVar40;
                        if ((ulong *)((long)puVar47 - 7U) <= puVar18) {
                          if ((puVar18 < (ulong *)((long)puVar47 - 3U)) &&
                             ((int)*puVar8 == (int)*puVar18)) {
                            puVar18 = (ulong *)((long)puVar18 + 4);
                            puVar8 = (ulong *)((long)puVar8 + 4);
                          }
                          if ((puVar18 < (ulong *)((long)puVar47 - 1U)) &&
                             ((short)*puVar8 == (short)*puVar18)) {
                            puVar18 = (ulong *)((long)puVar18 + 2);
                            puVar8 = (ulong *)((long)puVar8 + 2);
                          }
                          if (puVar18 < puVar47) {
                            uVar26 = *puVar8;
                            puVar8 = (ulong *)CONCAT71((int7)((ulong)puVar8 >> 8),(char)uVar26);
                            puVar18 = (ulong *)((long)puVar18 +
                                               (ulong)((char)uVar26 == (char)*puVar18));
                          }
                          uVar26 = (ulong)(uint)((int)puVar18 - (int)puVar17);
                          goto LAB_00113644;
                        }
                        uVar26 = *puVar8;
                        uVar49 = *puVar18;
                        uVar36 = uVar49 ^ uVar26;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        iVar14 = (int)puVar18;
                        puVar8 = puVar8 + 1;
                        puVar18 = puVar18 + 1;
                        puVar40 = puVar8;
                      } while (uVar26 == uVar49);
                      uVar26 = (ulong)((((uint)(uVar39 >> 3) & 0x1fffffff) + iVar14) - (int)puVar17)
                      ;
                    }
LAB_00113644:
                    uVar15 = (uint)uVar26;
                    puVar43 = (ulong *)((long)puVar43 + uVar26 + 4);
                    if (puVar43 == puVar47) {
                      puVar18 = puVar47;
                      puVar17 = (ulong *)source;
                      if (puVar47 < puVar7) {
                        uVar26 = *(ulong *)source;
                        uVar49 = *puVar47;
                        uVar39 = 0;
                        if ((uVar49 ^ uVar26) != 0) {
                          for (; ((uVar49 ^ uVar26) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        puVar8 = (ulong *)(uVar39 >> 3 & 0x1fffffff);
                        uVar29 = (uint)puVar8;
                        if (uVar26 == uVar49) {
                          puVar17 = (ulong *)(source + (ulong)(uVar26 == uVar49) * 8);
                          puVar18 = puVar47 + (uVar26 == uVar49);
                          goto LAB_00113696;
                        }
                      }
                      else {
LAB_00113696:
                        do {
                          if (puVar7 <= puVar18) {
                            if ((puVar18 < puVar27 + -8) && ((int)*puVar17 == (int)*puVar18)) {
                              puVar18 = (ulong *)((long)puVar18 + 4);
                              puVar17 = (ulong *)((long)puVar17 + 4);
                            }
                            if ((puVar18 < puVar27 + -6) && ((short)*puVar17 == (short)*puVar18)) {
                              puVar18 = (ulong *)((long)puVar18 + 2);
                              puVar17 = (ulong *)((long)puVar17 + 2);
                            }
                            if (puVar18 < puVar31) {
                              puVar18 = (ulong *)((long)puVar18 +
                                                 (ulong)((char)*puVar17 == (char)*puVar18));
                            }
                            uVar29 = (int)puVar18 - (int)puVar47;
                            break;
                          }
                          uVar26 = *puVar17;
                          uVar39 = *puVar18 ^ uVar26;
                          uVar49 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                            }
                          }
                          puVar40 = (ulong *)((uVar49 >> 3 & 0x1fffffff) + (long)puVar18);
                          puVar17 = puVar17 + 1;
                          bVar50 = uVar26 == *puVar18;
                          puVar18 = puVar18 + 1;
                          if (!bVar50) {
                            puVar18 = puVar40;
                          }
                          puVar8 = (ulong *)((ulong)puVar8 & 0xffffffff);
                          if (!bVar50) {
                            puVar8 = (ulong *)(ulong)(uint)((int)puVar40 - (int)puVar47);
                          }
                          uVar29 = (uint)puVar8;
                        } while (bVar50);
                      }
                      uVar15 = uVar15 + uVar29;
                      puVar43 = (ulong *)((long)puVar43 + (ulong)uVar29);
                    }
                  }
                  else {
                    puVar8 = (ulong *)((long)puVar43 + 4);
                    puVar47 = (ulong *)(local_d8 + 1);
                    puVar17 = puVar8;
                    if (puVar8 < puVar7) {
                      uVar49 = *(ulong *)((long)puVar43 + 4) ^ *(ulong *)(local_d8 + 1);
                      uVar26 = 0;
                      if (uVar49 != 0) {
                        for (; (uVar49 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                        }
                      }
                      uVar26 = uVar26 >> 3 & 0x1fffffff;
                      puVar17 = (ulong *)((long)puVar43 + 0xc);
                      puVar47 = (ulong *)(local_d8 + 3);
                      if (*(ulong *)(local_d8 + 1) == *(ulong *)((long)puVar43 + 4))
                      goto LAB_00113559;
                    }
                    else {
LAB_00113559:
                      do {
                        if (puVar7 <= puVar17) {
                          if ((puVar17 < puVar27 + -8) && ((int)*puVar47 == (int)*puVar17)) {
                            puVar17 = (ulong *)((long)puVar17 + 4);
                            puVar47 = (ulong *)((long)puVar47 + 4);
                          }
                          if ((puVar17 < puVar27 + -6) && ((short)*puVar47 == (short)*puVar17)) {
                            puVar17 = (ulong *)((long)puVar17 + 2);
                            puVar47 = (ulong *)((long)puVar47 + 2);
                          }
                          if (puVar17 < puVar31) {
                            puVar17 = (ulong *)((long)puVar17 +
                                               (ulong)((char)*puVar47 == (char)*puVar17));
                          }
                          uVar26 = (ulong)(uint)((int)puVar17 - (int)puVar8);
                          goto LAB_00113594;
                        }
                        uVar26 = *puVar47;
                        uVar49 = *puVar17;
                        uVar36 = uVar49 ^ uVar26;
                        uVar39 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                          }
                        }
                        iVar14 = (int)puVar17;
                        puVar47 = puVar47 + 1;
                        puVar17 = puVar17 + 1;
                      } while (uVar26 == uVar49);
                      uVar26 = (ulong)((((uint)(uVar39 >> 3) & 0x1fffffff) + iVar14) - (int)puVar8);
                    }
LAB_00113594:
                    uVar15 = (uint)uVar26;
                    puVar43 = (ulong *)((long)puVar43 + uVar26 + 4);
                  }
                  puVar8 = (ulong *)((long)puVar28 + 2);
                  pcVar24 = (char *)((long)puVar28 + (ulong)(uVar15 + 0xf0) / 0xff + 8);
                  if (pcVar24 <= pcVar6) {
                    if (uVar15 < 0xf) {
                      *(char *)local_f8 = (char)*local_f8 + (char)uVar15;
                    }
                    else {
                      *(char *)local_f8 = (char)*local_f8 + '\x0f';
                      uVar29 = uVar15 - 0xf;
                      *(undefined4 *)puVar8 = 0xffffffff;
                      if (0x3fb < uVar29) {
                        uVar15 = uVar15 - 0x40b;
                        memset((char *)((long)puVar28 + 6),0xff,(ulong)((uVar15 / 0x3fc) * 4 + 4));
                        uVar29 = uVar15 % 0x3fc;
                        puVar8 = (ulong *)((long)puVar28 + (ulong)((uVar15 / 0x3fc) * 4) + 6);
                      }
                      pcVar9 = (char *)((long)puVar8 + (ulong)uVar29 / 0xff);
                      puVar8 = (ulong *)(pcVar9 + 1);
                      *pcVar9 = (char)((ulong)uVar29 * 0x8080808081 >> 0x27);
                    }
                  }
                  puVar28 = puVar8;
                  puVar47 = puVar43;
                  if (pcVar6 < pcVar24) {
                    iVar11 = 1;
                    goto LAB_001139e9;
                  }
                  local_e0 = puVar43;
                  if (puVar27 + -0xb <= puVar43) {
                    iVar11 = 3;
                    goto LAB_001139e9;
                  }
                  *(int *)((long)LZ4_stream +
                          ((ulong)(*(long *)((long)puVar43 + -2) * -0x30e4432345000000) >> 0x34) * 4
                          ) = ((int)puVar43 + -2) - iVar12;
                  uVar26 = *puVar43 * -0x30e4432345000000 >> 0x34;
                  uVar15 = *(uint *)((long)LZ4_stream + uVar26 * 4);
                  if (uVar15 < uVar16) {
                    uVar15 = iVar22 + __src->hashTable[uVar26];
                    local_d8 = (int *)((long)piVar20 + (ulong)__src->hashTable[uVar26] + lVar5);
                    local_a0 = piVar20;
                  }
                  else {
                    local_d8 = (int *)((ulong)uVar15 + lVar30);
                    local_a0 = (int *)source;
                  }
                  uVar29 = (int)puVar43 - iVar12;
                  *(uint *)((long)LZ4_stream + uVar26 * 4) = uVar29;
                  bVar50 = true;
                  if ((uVar29 <= uVar15 + 0xffff) && (*local_d8 == (int)*puVar43)) {
                    *(char *)puVar8 = '\0';
                    iVar23 = uVar29 - uVar15;
                    bVar50 = false;
                    puVar28 = (ulong *)((long)puVar8 + 1);
                    local_f8 = puVar8;
                  }
                } while (!bVar50);
                uVar25 = (ulong)(*(long *)((long)puVar43 + 1) * -0x30e4432345000000) >> 0x34;
                iVar11 = 0;
                puVar47 = (ulong *)((long)puVar43 + 1);
              }
            }
LAB_001139e9:
            local_f8 = puVar28;
          } while (iVar11 == 0);
          dest = (char *)local_f8;
          if (1 < iVar11 - 2U) goto LAB_00115b2b;
        }
        uVar25 = (long)puVar27 - (long)local_e0;
        pcVar24 = (char *)((long)dest + (uVar25 + 0xf0) / 0xff + uVar25 + 1);
        if (pcVar24 <= pcVar6) {
          if (uVar25 < 0xf) {
            *dest = (char)uVar25 << 4;
          }
          else {
            uVar26 = uVar25 - 0xf;
            *dest = -0x10;
            puVar31 = (ulong *)((long)dest + 1);
            if (0xfe < uVar26) {
              uVar26 = (uVar25 - 0x10e) / 0xff;
              memset(puVar31,0xff,uVar26 + 1);
              puVar31 = (ulong *)((long)dest + uVar26 + 2);
              uVar26 = (uVar25 + uVar26 * -0xff) - 0x10e;
            }
            *(char *)puVar31 = (char)uVar26;
            dest = (char *)puVar31;
          }
          memcpy((char *)((long)dest + 1),local_e0,uVar25);
          dest = (char *)((long)dest + uVar25 + 1);
        }
        iVar3 = 0;
        if (pcVar24 <= pcVar6) {
          iVar3 = (int)dest - iVar44;
        }
        goto LAB_00115c57;
      }
    }
LAB_00113a18:
    iVar3 = 0;
LAB_00115c57:
    (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
    (LZ4_stream->internal_donotuse).dictSize = inputSize;
    return iVar3;
  }
  uVar16 = (LZ4_stream->internal_donotuse).dictSize;
  uVar25 = (ulong)uVar16;
  local_e8 = (long *)source;
  if (uVar25 < 0x10000) {
    uVar2 = (LZ4_stream->internal_donotuse).currentOffset;
    if (uVar2 <= uVar16) goto LAB_00112841;
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    pcVar6 = dest + maxOutputSize;
    (LZ4_stream->internal_donotuse).dictSize = inputSize + uVar16;
    (LZ4_stream->internal_donotuse).currentOffset = uVar2 + inputSize;
    (LZ4_stream->internal_donotuse).tableType = 2;
    if (inputSize < 0xd) {
LAB_00115908:
      uVar25 = (long)puVar27 - (long)source;
      pcVar24 = (char *)((long)dest + (uVar25 + 0xf0) / 0xff + uVar25 + 1);
      if (pcVar24 <= pcVar6) {
        if (uVar25 < 0xf) {
          *dest = (char)uVar25 << 4;
        }
        else {
          uVar26 = uVar25 - 0xf;
          *dest = -0x10;
          plVar33 = (long *)((long)dest + 1);
          if (0xfe < uVar26) {
            uVar26 = (uVar25 - 0x10e) / 0xff;
            memset(plVar33,0xff,uVar26 + 1);
            plVar33 = (long *)((long)dest + uVar26 + 2);
            uVar26 = (uVar25 + uVar26 * -0xff) - 0x10e;
          }
          *(char *)plVar33 = (char)uVar26;
          dest = (char *)plVar33;
        }
        memcpy((char *)((long)dest + 1),source,uVar25);
        dest = (char *)((long)dest + uVar25 + 1);
      }
      if (pcVar6 < pcVar24) {
        return 0;
      }
      return (int)dest - iVar44;
    }
    lVar5 = (long)source - (ulong)uVar2;
    *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
         uVar2;
    plVar33 = (long *)(source + 1);
    uVar26 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
    local_b8 = (long *)dest;
    do {
      iVar22 = 1;
      iVar23 = iVar3 << 6;
      while( true ) {
        plVar32 = (long *)((long)iVar22 + (long)plVar33);
        iVar22 = (int)plVar33;
        iVar14 = (int)lVar5;
        if (puVar27 + -0xb < plVar32) {
          iVar12 = 2;
        }
        else {
          uVar15 = *(uint *)((long)LZ4_stream + uVar26 * 4);
          piVar20 = (int *)((ulong)uVar15 + lVar5);
          uVar49 = (ulong)(*plVar32 * -0x30e4432345000000) >> 0x34;
          *(int *)((long)LZ4_stream + uVar26 * 4) = iVar22 - iVar14;
          iVar12 = 8;
          uVar26 = uVar49;
          if (((uVar2 - uVar16 <= uVar15) && ((uint)(iVar22 - iVar14) <= uVar15 + 0xffff)) &&
             (iVar12 = 7, *piVar20 != (int)*plVar33)) {
            iVar12 = 0;
          }
        }
        if ((iVar12 != 0) && (iVar12 != 8)) break;
        iVar22 = iVar23 >> 6;
        iVar23 = iVar23 + 1;
        plVar33 = plVar32;
      }
      if (iVar12 == 7) {
        iVar12 = 0;
      }
      plVar32 = local_b8;
      if (iVar12 == 0) {
        uVar29 = iVar22 - (int)local_e8;
        lVar30 = 0;
        cVar1 = (char)plVar33 * '\x10' + (char)local_e8 * -0x10;
        uVar15 = uVar29 - 0xf;
        do {
          uVar42 = uVar15;
          cVar34 = cVar1;
          lVar41 = lVar30;
          piVar4 = (int *)((long)piVar20 + lVar41);
          plVar10 = (long *)((long)plVar33 + lVar41);
          if ((piVar4 <= source + -uVar25) || (plVar10 <= local_e8)) break;
          lVar30 = lVar41 + -1;
          cVar1 = cVar34 + -0x10;
          uVar15 = uVar42 - 1;
        } while (*(char *)((long)plVar33 + lVar41 + -1) == *(char *)((long)piVar20 + lVar41 + -1));
        iVar23 = (int)lVar41;
        uVar49 = (ulong)(uint)(iVar23 + (iVar22 - (int)local_e8));
        plVar32 = (long *)((long)local_b8 + 1);
        pcVar24 = (char *)((long)local_b8 +
                          ((ulong)uVar29 + lVar41 & 0xffffffff) / 0xff + uVar49 + 9);
        if (pcVar6 < pcVar24) {
          iVar12 = 1;
        }
        else {
          if ((uint)((ulong)uVar29 + lVar41) < 0xf) {
            *(char *)local_b8 = cVar34;
            plVar33 = plVar32;
          }
          else {
            uVar39 = (ulong)(uVar29 - 0xf) + lVar41;
            *(char *)local_b8 = -0x10;
            if (0xfe < (int)uVar39) {
              if (0x1fc < (int)uVar42) {
                uVar42 = 0x1fd;
              }
              uVar15 = (uVar29 - uVar42) + iVar23 + 0xef;
              uVar39 = (ulong)uVar15 / 0xff;
              memset(plVar32,0xff,(ulong)(uVar15 / 0xff + 1));
              plVar32 = (long *)((long)local_b8 + uVar39 + 2);
              uVar39 = (ulong)((uVar29 - 0x10e) + iVar23 + (int)uVar39 * -0xff);
            }
            *(char *)plVar32 = (char)uVar39;
            plVar33 = (long *)((long)plVar32 + 1);
          }
          plVar32 = (long *)(uVar49 + (long)plVar33);
          plVar21 = local_e8;
          do {
            *plVar33 = *plVar21;
            plVar33 = plVar33 + 1;
            plVar21 = plVar21 + 1;
          } while (plVar33 < plVar32);
          iVar12 = 0;
        }
        plVar33 = plVar10;
        piVar20 = piVar4;
        if (pcVar24 <= pcVar6) {
          do {
            uVar49 = 0xcf1bbcdcbb000000;
            *(short *)plVar32 = (short)plVar10 - (short)piVar4;
            puVar31 = (ulong *)((long)plVar10 + 4);
            puVar7 = (ulong *)(piVar4 + 1);
            puVar47 = puVar31;
            if (puVar31 < puVar27 + -0xc) {
              uVar39 = *(ulong *)((long)plVar10 + 4) ^ *(ulong *)(piVar4 + 1);
              uVar49 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                }
              }
              uVar49 = uVar49 >> 3 & 0x1fffffff;
              uVar15 = (uint)uVar49;
              puVar47 = (ulong *)((long)plVar10 + 0xc);
              puVar7 = (ulong *)(piVar4 + 3);
              if (*(ulong *)(piVar4 + 1) == *(ulong *)((long)plVar10 + 4)) goto LAB_00115636;
            }
            else {
LAB_00115636:
              do {
                if (puVar27 + -0xc <= puVar47) {
                  if ((puVar47 < puVar27 + -8) && ((int)*puVar7 == (int)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 4);
                    puVar7 = (ulong *)((long)puVar7 + 4);
                  }
                  if ((puVar47 < puVar27 + -6) && ((short)*puVar7 == (short)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 2);
                    puVar7 = (ulong *)((long)puVar7 + 2);
                  }
                  if (puVar47 < puVar27 + -5) {
                    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar7 == (char)*puVar47));
                  }
                  uVar15 = (int)puVar47 - (int)puVar31;
                  break;
                }
                uVar39 = *puVar7;
                uVar35 = *puVar47 ^ uVar39;
                uVar36 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                puVar28 = (ulong *)((uVar36 >> 3 & 0x1fffffff) + (long)puVar47);
                puVar7 = puVar7 + 1;
                bVar50 = uVar39 == *puVar47;
                puVar47 = puVar47 + 1;
                if (!bVar50) {
                  puVar47 = puVar28;
                }
                uVar49 = uVar49 & 0xffffffff;
                if (!bVar50) {
                  uVar49 = (ulong)(uint)((int)puVar28 - (int)puVar31);
                }
                uVar15 = (uint)uVar49;
              } while (bVar50);
            }
            plVar21 = (long *)((long)plVar32 + 2);
            pcVar24 = (char *)((long)plVar32 + (ulong)(uVar15 + 0xf0) / 0xff + 8);
            if (pcVar24 <= pcVar6) {
              if (uVar15 < 0xf) {
                *(char *)local_b8 = (char)*local_b8 + (char)uVar15;
              }
              else {
                *(char *)local_b8 = (char)*local_b8 + '\x0f';
                uVar29 = uVar15 - 0xf;
                *(undefined4 *)plVar21 = 0xffffffff;
                if (0x3fb < uVar29) {
                  uVar42 = uVar15 - 0x40b;
                  memset((char *)((long)plVar32 + 6),0xff,(ulong)((uVar42 / 0x3fc) * 4 + 4));
                  uVar29 = uVar42 % 0x3fc;
                  plVar21 = (long *)((long)plVar32 + (ulong)((uVar42 / 0x3fc) * 4) + 6);
                }
                pcVar9 = (char *)((long)plVar21 + (ulong)uVar29 / 0xff);
                plVar21 = (long *)(pcVar9 + 1);
                *pcVar9 = (char)(uVar29 / 0xff) + (char)uVar29;
              }
            }
            lVar30 = (ulong)uVar15 + (long)plVar10;
            plVar10 = (long *)(lVar30 + 4);
            plVar33 = plVar10;
            plVar32 = plVar21;
            piVar20 = piVar4;
            if (pcVar6 < pcVar24) {
              iVar12 = 1;
              goto LAB_001158d1;
            }
            local_e8 = plVar10;
            if (puVar27 + -0xb <= plVar10) {
              iVar12 = 3;
              goto LAB_001158d1;
            }
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)(lVar30 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)lVar30 + 2) - iVar14;
            uVar49 = (ulong)(*plVar10 * -0x30e4432345000000) >> 0x34;
            uVar29 = (int)plVar10 - iVar14;
            uVar15 = *(uint *)((long)LZ4_stream + uVar49 * 4);
            piVar4 = (int *)((ulong)uVar15 + lVar5);
            *(uint *)((long)LZ4_stream + uVar49 * 4) = uVar29;
            bVar50 = true;
            if (((uVar2 - uVar16 <= uVar15) && (uVar29 <= uVar15 + 0xffff)) &&
               (*piVar4 == *(int *)plVar10)) {
              *(char *)plVar21 = '\0';
              bVar50 = false;
              plVar32 = (long *)((long)plVar21 + 1);
              local_b8 = plVar21;
            }
          } while (!bVar50);
          uVar26 = (ulong)(*(long *)(lVar30 + 5) * -0x30e4432345000000) >> 0x34;
          iVar12 = 0;
          plVar33 = (long *)(lVar30 + 5);
          piVar20 = piVar4;
        }
      }
LAB_001158d1:
      local_b8 = plVar32;
    } while (iVar12 == 0);
    dest = (char *)local_b8;
    source = (char *)local_e8;
    if (iVar12 - 2U < 2) goto LAB_00115908;
LAB_001159af:
    iVar3 = 0;
  }
  else {
LAB_00112841:
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    uVar2 = (LZ4_stream->internal_donotuse).currentOffset;
    pcVar6 = dest + maxOutputSize;
    (LZ4_stream->internal_donotuse).dictSize = uVar16 + inputSize;
    (LZ4_stream->internal_donotuse).currentOffset = uVar2 + inputSize;
    (LZ4_stream->internal_donotuse).tableType = 2;
    if (0xc < inputSize) {
      lVar5 = (long)source - (ulong)uVar2;
      plVar33 = (long *)(puVar27 + -0xb);
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar2;
      plVar32 = (long *)(source + 1);
      uVar26 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      plVar10 = (long *)dest;
      do {
        iVar22 = 1;
        iVar23 = iVar3 << 6;
        while( true ) {
          plVar21 = (long *)((long)iVar22 + (long)plVar32);
          iVar22 = (int)plVar32;
          iVar14 = (int)lVar5;
          if (plVar33 < plVar21) {
            iVar12 = 2;
          }
          else {
            uVar16 = *(uint *)((long)LZ4_stream + uVar26 * 4);
            local_a0 = (int *)((ulong)uVar16 + lVar5);
            uVar49 = (ulong)(*plVar21 * -0x30e4432345000000) >> 0x34;
            *(int *)((long)LZ4_stream + uVar26 * 4) = iVar22 - iVar14;
            iVar12 = 8;
            uVar26 = uVar49;
            if (((uint)(iVar22 - iVar14) <= uVar16 + 0xffff) &&
               (iVar12 = 7, *local_a0 != (int)*plVar32)) {
              iVar12 = 0;
            }
          }
          if ((iVar12 != 0) && (iVar12 != 8)) break;
          iVar22 = iVar23 >> 6;
          iVar23 = iVar23 + 1;
          plVar32 = plVar21;
        }
        if (iVar12 == 7) {
          iVar12 = 0;
        }
        dest = (char *)plVar10;
        if (iVar12 == 0) {
          uVar2 = iVar22 - (int)local_e8;
          lVar30 = 0;
          cVar1 = (char)plVar32 * '\x10' + (char)local_e8 * -0x10;
          uVar16 = uVar2 - 0xf;
          do {
            uVar15 = uVar16;
            cVar34 = cVar1;
            lVar41 = lVar30;
            piVar20 = (int *)((long)local_a0 + lVar41);
            plVar21 = (long *)((long)plVar32 + lVar41);
            if ((piVar20 <= source + -uVar25) || (plVar21 <= local_e8)) break;
            lVar30 = lVar41 + -1;
            cVar1 = cVar34 + -0x10;
            uVar16 = uVar15 - 1;
          } while (*(char *)((long)plVar32 + lVar41 + -1) == *(char *)((long)local_a0 + lVar41 + -1)
                  );
          iVar23 = (int)lVar41;
          plVar48 = (long *)(ulong)(uint)(iVar23 + (iVar22 - (int)local_e8));
          dest = (char *)((long)plVar10 + 1);
          puVar19 = (undefined1 *)((long)plVar10 + (long)plVar48);
          if (pcVar6 < puVar19 + ((ulong)uVar2 + lVar41 & 0xffffffff) / 0xff + 9) {
            iVar12 = 1;
          }
          else {
            if ((uint)((ulong)uVar2 + lVar41) < 0xf) {
              *(char *)plVar10 = cVar34;
              plVar32 = (long *)dest;
            }
            else {
              uVar49 = (ulong)(uVar2 - 0xf) + lVar41;
              *(undefined1 *)plVar10 = 0xf0;
              if (0xfe < (int)uVar49) {
                if (0x1fc < (int)uVar15) {
                  uVar15 = 0x1fd;
                }
                uVar16 = (uVar2 - uVar15) + iVar23 + 0xef;
                uVar49 = (ulong)uVar16 / 0xff;
                memset(dest,0xff,(ulong)(uVar16 / 0xff + 1));
                dest = (char *)((long)plVar10 + uVar49 + 2);
                uVar49 = (ulong)((uVar2 - 0x10e) + iVar23 + (int)uVar49 * -0xff);
              }
              *dest = (char)uVar49;
              plVar32 = (long *)((long)dest + 1);
            }
            dest = (char *)((long)plVar48 + (long)plVar32);
            plVar48 = local_e8;
            do {
              *plVar32 = *plVar48;
              plVar32 = plVar32 + 1;
              plVar48 = plVar48 + 1;
            } while (plVar32 < dest);
            iVar12 = 0;
            plVar48 = (long *)dest;
          }
          plVar32 = plVar21;
          local_a0 = piVar20;
          if (puVar19 + ((ulong)uVar2 + lVar41 & 0xffffffff) / 0xff + 9 <= pcVar6) {
            do {
              *(short *)dest = (short)plVar21 - (short)piVar20;
              puVar31 = (ulong *)((long)plVar21 + 4);
              puVar7 = (ulong *)(piVar20 + 1);
              puVar47 = puVar31;
              if (puVar31 < puVar27 + -0xc) {
                uVar39 = *(ulong *)((long)plVar21 + 4) ^ *(ulong *)(piVar20 + 1);
                uVar49 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                  }
                }
                plVar48 = (long *)(uVar49 >> 3 & 0x1fffffff);
                uVar16 = (uint)plVar48;
                puVar47 = (ulong *)((long)plVar21 + 0xc);
                puVar7 = (ulong *)(piVar20 + 3);
                if (*(ulong *)(piVar20 + 1) == *(ulong *)((long)plVar21 + 4)) goto LAB_00114dd3;
              }
              else {
LAB_00114dd3:
                do {
                  if (puVar27 + -0xc <= puVar47) {
                    if ((puVar47 < puVar27 + -8) && ((int)*puVar7 == (int)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 4);
                      puVar7 = (ulong *)((long)puVar7 + 4);
                    }
                    if ((puVar47 < puVar27 + -6) && ((short)*puVar7 == (short)*puVar47)) {
                      puVar47 = (ulong *)((long)puVar47 + 2);
                      puVar7 = (ulong *)((long)puVar7 + 2);
                    }
                    if (puVar47 < puVar27 + -5) {
                      puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar7 == (char)*puVar47));
                    }
                    uVar16 = (int)puVar47 - (int)puVar31;
                    break;
                  }
                  uVar49 = *puVar7;
                  uVar36 = *puVar47 ^ uVar49;
                  uVar39 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  puVar28 = (ulong *)((uVar39 >> 3 & 0x1fffffff) + (long)puVar47);
                  puVar7 = puVar7 + 1;
                  bVar50 = uVar49 == *puVar47;
                  puVar47 = puVar47 + 1;
                  if (!bVar50) {
                    puVar47 = puVar28;
                  }
                  plVar48 = (long *)((ulong)plVar48 & 0xffffffff);
                  if (!bVar50) {
                    plVar48 = (long *)(ulong)(uint)((int)puVar28 - (int)puVar31);
                  }
                  uVar16 = (uint)plVar48;
                } while (bVar50);
              }
              plVar48 = (long *)((long)dest + 2);
              pcVar24 = (char *)((long)dest + (ulong)(uVar16 + 0xf0) / 0xff + 8);
              if (pcVar24 <= pcVar6) {
                if (uVar16 < 0xf) {
                  *(char *)plVar10 = (char)*plVar10 + (char)uVar16;
                }
                else {
                  *(char *)plVar10 = (char)*plVar10 + '\x0f';
                  uVar2 = uVar16 - 0xf;
                  *(int *)plVar48 = -1;
                  if (0x3fb < uVar2) {
                    uVar15 = uVar16 - 0x40b;
                    memset((undefined1 *)((long)dest + 6),0xff,(ulong)((uVar15 / 0x3fc) * 4 + 4));
                    uVar2 = uVar15 % 0x3fc;
                    plVar48 = (long *)((long)dest + (ulong)((uVar15 / 0x3fc) * 4) + 6);
                  }
                  pcVar9 = (char *)((long)plVar48 + (ulong)uVar2 / 0xff);
                  plVar48 = (long *)(pcVar9 + 1);
                  *pcVar9 = (char)(uVar2 / 0xff) + (char)uVar2;
                }
              }
              puVar19 = (undefined1 *)((ulong)uVar16 + (long)plVar21);
              plVar21 = (long *)(puVar19 + 4);
              plVar32 = plVar21;
              dest = (char *)plVar48;
              local_a0 = piVar20;
              if (pcVar6 < pcVar24) {
                iVar12 = 1;
                goto LAB_00114fff;
              }
              local_e8 = plVar21;
              if (plVar33 <= plVar21) {
                iVar12 = 3;
                goto LAB_00114fff;
              }
              *(int *)((long)LZ4_stream +
                      ((ulong)(*(long *)(puVar19 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)puVar19 + 2) - iVar14;
              uVar49 = (ulong)(*plVar21 * -0x30e4432345000000) >> 0x34;
              uVar2 = (int)plVar21 - iVar14;
              uVar16 = *(uint *)((long)LZ4_stream + uVar49 * 4);
              piVar20 = (int *)((ulong)uVar16 + lVar5);
              *(uint *)((long)LZ4_stream + uVar49 * 4) = uVar2;
              bVar50 = true;
              if ((uVar2 <= uVar16 + 0xffff) && (*piVar20 == (int)*plVar21)) {
                *(undefined1 *)plVar48 = 0;
                bVar50 = false;
                dest = (char *)((long)plVar48 + 1);
                plVar10 = plVar48;
              }
              plVar48 = plVar33;
            } while (!bVar50);
            uVar26 = (ulong)(*(long *)(puVar19 + 5) * -0x30e4432345000000) >> 0x34;
            iVar12 = 0;
            plVar32 = (long *)(puVar19 + 5);
            local_a0 = piVar20;
          }
        }
LAB_00114fff:
        plVar10 = (long *)dest;
      } while (iVar12 == 0);
      if (1 < iVar12 - 2U) goto LAB_001159af;
    }
    uVar25 = (long)puVar27 - (long)local_e8;
    pcVar24 = (char *)((long)dest + (uVar25 + 0xf0) / 0xff + uVar25 + 1);
    if (pcVar24 <= pcVar6) {
      if (uVar25 < 0xf) {
        *dest = (char)uVar25 << 4;
      }
      else {
        uVar26 = uVar25 - 0xf;
        *dest = 0xf0;
        plVar33 = (long *)((long)dest + 1);
        if (0xfe < uVar26) {
          uVar49 = (uVar25 - 0x10e) / 0xff;
          memset((long *)((long)dest + 1),0xff,uVar49 + 1);
          uVar26 = (uVar25 + uVar49 * -0xff) - 0x10e;
          plVar33 = (long *)((long)dest + uVar49 + 2);
        }
        dest = (char *)plVar33;
        *dest = (char)uVar26;
      }
      memcpy((undefined1 *)((long)dest + 1),local_e8,uVar25);
      dest = (char *)((long)dest + uVar25 + 1);
    }
    iVar3 = 0;
    if (pcVar24 <= pcVar6) {
      iVar3 = (int)dest - iVar44;
    }
  }
  return iVar3;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i)", inputSize);

    if (streamPtr->dirty) { return 0; } /* Uninitialized structure detected */
    LZ4_renormDictT(streamPtr, inputSize);   /* avoid index overflow */
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize-1 < 4-1)   /* intentional underflow */
      && (dictEnd != (const BYTE*)source) ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = (const BYTE*)source;
    }

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                memcpy(streamPtr, streamPtr->dictCtx, sizeof(LZ4_stream_t));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}